

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O1

void __thiscall Transporter::~Transporter(Transporter *this)

{
  this->_vptr_Transporter = (_func_int **)&PTR__Transporter_0017f4c8;
  if (this->buf != (char *)0x0) {
    free(this->buf);
  }
  (*this->_vptr_Transporter[2])(this);
  if ((this->thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->thread)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

Transporter::~Transporter()
{
	if (buf)
	{
		free(buf);
	}
	Stop();
	if (thread.joinable())
		thread.join();
}